

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O0

int muduo::ProcessInfo::numThreads(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t pos;
  string status;
  int result;
  string local_28 [36];
  int local_4;
  
  local_4 = 0;
  procStatus_abi_cxx11_();
  lVar2 = std::__cxx11::string::find((char *)local_28,0x15690d);
  if (lVar2 != -1) {
    lVar3 = std::__cxx11::string::c_str();
    local_4 = atoi((char *)(lVar3 + lVar2 + 8));
  }
  iVar1 = local_4;
  std::__cxx11::string::~string(local_28);
  return iVar1;
}

Assistant:

int ProcessInfo::numThreads()
{
  int result = 0;
  string status = procStatus();
  size_t pos = status.find("Threads:");
  if (pos != string::npos)
  {
    result = ::atoi(status.c_str() + pos + 8);
  }
  return result;
}